

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O3

_Bool history_is_artifact_known(player *p,artifact *artifact)

{
  _Bool _Var1;
  long lVar2;
  size_t sVar3;
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0x90,"_Bool history_is_artifact_known(struct player *, const struct artifact *)")
    ;
  }
  sVar3 = (p->hist).next;
  if (sVar3 != 0) {
    lVar2 = sVar3 * 0x5c;
    do {
      _Var1 = flag_has_dbg((p->hist).entries[-1].type + lVar2,2,3,"h->entries[i].type",
                           "HIST_ARTIFACT_KNOWN");
      if ((_Var1) && (artifact->aidx == (uint)(p->hist).entries[-1].type[lVar2 + 6])) {
        return true;
      }
      sVar3 = sVar3 - 1;
      lVar2 = lVar2 + -0x5c;
    } while (sVar3 != 0);
  }
  return false;
}

Assistant:

bool history_is_artifact_known(struct player *p, const struct artifact *artifact)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	assert(artifact);

	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_KNOWN) &&
				h->entries[i].a_idx == artifact->aidx)
			return true;
	}

	return false;
}